

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

double ON_MeshParameters::ClampMeshDensityValue(double slider_value)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (1.490116119385e-08 < ABS(slider_value)) {
    if ((slider_value < 0.4999999850988388) || (0.5000000149011612 < slider_value)) {
      if ((slider_value < 0.9999999850988388) || (1.0000000149011612 < slider_value)) {
        if ((slider_value < 0.0) || (dVar1 = slider_value, 1.0 < slider_value)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                     ,0x1c5e,"","Invalid slider_value - defaulting to 0.5");
          dVar1 = 0.5;
        }
      }
      else {
        dVar1 = 1.0;
      }
    }
    else {
      dVar1 = 0.5;
    }
  }
  return dVar1;
}

Assistant:

double ON_MeshParameters::ClampMeshDensityValue(double slider_value)
{
  // Make "fuzzy" values of 0.0, 0.5, and 1.0 exactly 0, 0.5, and 1.0 so
  // siders of various int resolutions and code that uses float instead 
  // of double precision values behaves in the expected way.
  if (slider_value >= -ON_SQRT_EPSILON && slider_value <= ON_SQRT_EPSILON)
    slider_value = 0.0;
  else if (slider_value >= (0.5 - ON_SQRT_EPSILON) && slider_value <= (0.5 + ON_SQRT_EPSILON))
    slider_value = 0.5;
  else if (slider_value >= (1.0 - ON_SQRT_EPSILON) && slider_value <= (1.0 + ON_SQRT_EPSILON))
    slider_value = 1.0;
  else if (false == (slider_value >= 0.0 && slider_value <= 1.0))
  {
    // If you get this error, your user interface code has a bug.
    ON_ERROR("Invalid slider_value - defaulting to 0.5");
    slider_value = 0.5; // invalid input treated as 0.5.
  }

  return slider_value;
}